

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

iterator __thiscall
QMap<QByteArray,_QByteArray>::insert
          (QMap<QByteArray,_QByteArray> *this,const_iterator pos,QByteArray *key,QByteArray *value)

{
  totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
  tVar1;
  const_iterator cVar2;
  iterator iVar3;
  long lVar4;
  totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
  tVar5;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tVar1.ptr = (this->d).d.ptr;
  if ((tVar1.ptr ==
       (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_40.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
          )(QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
            *)0x0;
    tVar5.ptr = tVar1.ptr;
  }
  else {
    LOCK();
    ((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
    tVar5.ptr = (this->d).d.ptr;
    local_40.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
          )(totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
            )tVar1.ptr;
  }
  if (tVar5.ptr ==
      (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
       *)0x0) {
LAB_001160bf:
    lVar4 = 0;
  }
  else {
    if ((__int_type)
        ((tVar5.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 1) goto LAB_001160f9;
    cVar2._M_node = ((tVar5.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((const_iterator)cVar2._M_node == pos.i._M_node) goto LAB_001160bf;
    lVar4 = 0;
    do {
      cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
      lVar4 = lVar4 + 1;
    } while ((const_iterator)cVar2._M_node != pos.i._M_node);
  }
  detach(this);
  tVar5.ptr = (this->d).d.ptr;
  pos.i._M_node =
       *(const_iterator *)
        ((long)&((tVar5.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  if (lVar4 < 1) {
    for (; lVar4 != 0; lVar4 = lVar4 + 1) {
      pos.i._M_node = (const_iterator)std::_Rb_tree_decrement((_Rb_tree_node_base *)pos.i._M_node);
    }
  }
  else {
    do {
      pos.i._M_node = (const_iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)pos.i._M_node);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
LAB_001160f9:
  iVar3 = std::
          map<QByteArray,QByteArray,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
          ::insert_or_assign<QByteArray_const&>
                    ((map<QByteArray,QByteArray,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
                      *)&(tVar5.ptr)->m,pos.i,key,value);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (iterator)(iterator)iVar3._M_node;
}

Assistant:

iterator insert(const_iterator pos, const Key &key, const T &value)
    {
        // TODO: improve. In case of assignment, why copying first?
        typename Map::const_iterator dpos;
        const auto copy = d.isShared() ? *this : QMap(); // keep `key`/`value` alive across the detach
        if (!d || d.isShared()) {
            auto posDistance = d ? std::distance(d->m.cbegin(), pos.i) : 0;
            detach();
            dpos = std::next(d->m.cbegin(), posDistance);
        } else {
            dpos = pos.i;
        }
        return iterator(d->m.insert_or_assign(dpos, key, value));
    }